

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetStringDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  char *pcVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  char *local_50;
  long local_48;
  char local_40 [32];
  
  if ((*(string **)(descriptor + 0x40))->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"\"","");
    return __return_storage_ptr__;
  }
  StringToBase64(&local_70,*(string **)(descriptor + 0x40));
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x406faf);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_c0 = *puVar7;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar7;
    local_d0 = (ulong *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_50 = local_40;
  pcVar4 = FastUInt64ToBufferLeft(*(uint64 *)(*(long *)(descriptor + 0x40) + 8),local_40);
  local_48 = (long)pcVar4 - (long)local_40;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,local_50,local_50 + local_48);
  uVar9 = 0xf;
  if (local_d0 != &local_c0) {
    uVar9 = local_c0;
  }
  if (uVar9 < (ulong)(local_a8 + local_c8)) {
    uVar9 = 0xf;
    if (local_b0 != local_a0) {
      uVar9 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_c8) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_002c1fe0;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
LAB_002c1fe0:
  local_f0 = &local_e0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_e0 = *puVar1;
    uStack_d8 = puVar5[3];
  }
  else {
    local_e0 = *puVar1;
    local_f0 = (undefined8 *)*puVar5;
  }
  local_e8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar8) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetStringDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "\"\"";
    else
      return "global::System.Text.Encoding.UTF8.GetString(global::System."
             "Convert.FromBase64String(\"" +
             StringToBase64(descriptor->default_value_string()) + "\"), 0, " + StrCat(descriptor->default_value_string().length()) + ")";
}